

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::cleanup::ChunkList::PeekForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ChunkList *this)

{
  CleanupNode *__x;
  Chunk *pCVar1;
  
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = this->head_;
  if (pCVar1 != (Chunk *)0x0) {
    __x = this->next_;
    while( true ) {
      while (__x = __x + -1, (CleanupNode *)(pCVar1 + 1) <= __x) {
        std::vector<void_*,_std::allocator<void_*>_>::push_back(__return_storage_ptr__,&__x->elem);
      }
      pCVar1 = pCVar1->next;
      if (pCVar1 == (Chunk *)0x0) break;
      __x = (CleanupNode *)((long)&pCVar1[1].next + (pCVar1->size - 0x10 & 0xfffffffffffffff0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ChunkList::PeekForTesting() {
  std::vector<void*> ret;
  Chunk* c = head_;
  if (c == nullptr) return ret;
  // Iterate backwards to match destruction order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    for (; it >= first; --it) {
      ret.push_back(it->elem);
    }
    c = c->next;
    if (c == nullptr) return ret;
    it = c->Last();
  };
}